

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlAddChildList(xmlNodePtr parent,xmlNodePtr cur)

{
  xmlNodePtr text;
  int iVar1;
  bool bVar2;
  _xmlNode *p_Var3;
  
  if (parent != (xmlNodePtr)0x0) {
    if (cur == (xmlNodePtr)0x0) {
      return (xmlNodePtr)0x0;
    }
    if (parent->type == XML_NAMESPACE_DECL) {
      return (xmlNodePtr)0x0;
    }
    bVar2 = false;
    p_Var3 = cur;
    if (cur->type == XML_NAMESPACE_DECL) {
      return (xmlNodePtr)0x0;
    }
    for (; p_Var3 != (xmlNodePtr)0x0; p_Var3 = p_Var3->next) {
      if ((p_Var3->doc != parent->doc) && (iVar1 = xmlSetTreeDoc(p_Var3,parent->doc), iVar1 < 0)) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      if (parent->children == (_xmlNode *)0x0) {
        parent->children = cur;
      }
      else {
        text = parent->last;
        p_Var3 = cur;
        if (((cur->type == XML_TEXT_NODE) && (text->type == XML_TEXT_NODE)) &&
           (cur->name == text->name)) {
          iVar1 = xmlTextAddContent(text,cur->content,-1);
          if (iVar1 < 0) {
            return (xmlNodePtr)0x0;
          }
          p_Var3 = cur->next;
          xmlFreeNode(cur);
          if (p_Var3 == (_xmlNode *)0x0) {
            return text;
          }
        }
        text->next = p_Var3;
        p_Var3->prev = text;
        cur = p_Var3;
      }
      do {
        p_Var3 = cur;
        p_Var3->parent = parent;
        cur = p_Var3->next;
      } while (p_Var3->next != (_xmlNode *)0x0);
      parent->last = p_Var3;
      return p_Var3;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlAddChildList(xmlNodePtr parent, xmlNodePtr cur) {
    xmlNodePtr iter;
    xmlNodePtr prev;
    int oom;

    if ((parent == NULL) || (parent->type == XML_NAMESPACE_DECL)) {
	return(NULL);
    }

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
	return(NULL);
    }

    oom = 0;
    for (iter = cur; iter != NULL; iter = iter->next) {
	if (iter->doc != parent->doc) {
	    if (xmlSetTreeDoc(iter, parent->doc) < 0)
                oom = 1;
	}
    }
    if (oom)
        return(NULL);

    /*
     * add the first element at the end of the children list.
     */

    if (parent->children == NULL) {
        parent->children = cur;
    } else {
        prev = parent->last;

	/*
	 * If cur and parent->last both are TEXT nodes, then merge them.
	 */
	if ((cur->type == XML_TEXT_NODE) &&
	    (prev->type == XML_TEXT_NODE) &&
	    (cur->name == prev->name)) {
            xmlNodePtr next;

            if (xmlTextAddContent(prev, cur->content, -1) < 0)
                return(NULL);
            next = cur->next;
	    xmlFreeNode(cur);
	    /*
	     * if it's the only child, nothing more to be done.
	     */
	    if (next == NULL)
		return(prev);
	    cur = next;
	}

	prev->next = cur;
	cur->prev = prev;
    }
    while (cur->next != NULL) {
	cur->parent = parent;
        cur = cur->next;
    }
    cur->parent = parent;
    parent->last = cur;

    return(cur);
}